

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

EC_KEY * d2i_ECPrivateKey(EC_KEY **key,uchar **in,long len)

{
  EC_GROUP *group;
  EC_KEY *pEVar1;
  CBS cbs;
  
  if ((key == (EC_KEY **)0x0) || (*key == (EC_KEY *)0x0)) {
    group = (EC_GROUP *)0x0;
  }
  else {
    group = (EC_GROUP *)EC_KEY_get0_group(*key);
  }
  if (len < 0) {
    pEVar1 = (EC_KEY *)0x0;
    ERR_put_error(0xf,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x191);
  }
  else {
    cbs.data = *in;
    cbs.len = len;
    pEVar1 = EC_KEY_parse_private_key(&cbs,group);
    if (pEVar1 != (EC_KEY *)0x0) {
      if (key != (EC_KEY **)0x0) {
        EC_KEY_free(*key);
        *key = (EC_KEY *)pEVar1;
      }
      *in = cbs.data;
    }
  }
  return (EC_KEY *)pEVar1;
}

Assistant:

EC_KEY *d2i_ECPrivateKey(EC_KEY **out, const uint8_t **inp, long len) {
  // This function treats its |out| parameter differently from other |d2i|
  // functions. If supplied, take the group from |*out|.
  const EC_GROUP *group = NULL;
  if (out != NULL && *out != NULL) {
    group = EC_KEY_get0_group(*out);
  }

  if (len < 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EC_KEY *ret = EC_KEY_parse_private_key(&cbs, group);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    EC_KEY_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}